

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_event_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
cbor_event_reader<jsoncons::stream_source<unsigned_char>>
          (cbor_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
          stream_source<unsigned_char> *source,cbor_decode_options *options,allocator<char> *alloc)

{
  uint uVar1;
  basic_item_event_receiver<char> *in_RDI;
  
  ser_context::ser_context((ser_context *)&in_RDI[7].shape_);
  basic_staj_event_reader<char>::basic_staj_event_reader((basic_staj_event_reader<char> *)in_RDI);
  (in_RDI->super_basic_item_event_visitor<char>)._vptr_basic_item_event_visitor =
       (_func_int **)(vtable + 0x18);
  in_RDI[7].shape_.data_ = (pointer)(vtable + 0xb8);
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>>
            ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
             this,source,options,alloc);
  basic_item_event_receiver<char>::basic_item_event_receiver(in_RDI);
  *(undefined1 *)&in_RDI[7].data_.size_ = 0;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::cursor_mode
            ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
             &in_RDI->event_,true);
  uVar1 = (*(in_RDI->super_basic_item_event_visitor<char>)._vptr_basic_item_event_visitor[3])();
  if ((uVar1 & 1) == 0) {
    (*(in_RDI->super_basic_item_event_visitor<char>)._vptr_basic_item_event_visitor[7])();
  }
  return;
}

Assistant:

cbor_event_reader(Sourceable&& source,
            const cbor_decode_options& options = cbor_decode_options(),
            const Allocator& alloc = Allocator())
            : parser_(std::forward<Sourceable>(source), options, alloc)
        {
            parser_.cursor_mode(true);
            if (!done())
            {
                next();
            }
        }